

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O1

void LoadSingleBuiltin<Sexp*(*)(Sexp*)>(Sexp *activation,char *name,_func_Sexp_ptr_Sexp_ptr *func)

{
  Environment *symbol;
  size_t extraout_RDX;
  NativeFunction func_00;
  NativeFunction local_c8;
  _Any_data local_b8;
  code *local_a8;
  undefined1 local_98 [16];
  string local_88;
  undefined1 auStack_68 [8];
  f_type stdfnc;
  ContractFrameProtector __contract_frame;
  Sexp *alloced_func;
  Sexp *activation_local;
  FrameProtector __frame_prot;
  
  alloced_func = activation;
  ContractFrameProtector::ContractFrameProtector
            ((ContractFrameProtector *)&stdfnc._M_invoker,"LoadSingleBuiltin");
  ContractFrame::CheckPrecondition
            ((ContractFrame *)stdfnc._M_invoker,alloced_func->kind == ACTIVATION,
             "activation->IsActivation()");
  FrameProtector::FrameProtector((FrameProtector *)&activation_local,"LoadSingleBuiltin");
  FrameProtector::ProtectValue((FrameProtector *)&activation_local,&alloced_func,"activation");
  __contract_frame.protected_frame = (ContractFrame *)0x0;
  FrameProtector::ProtectValue
            ((FrameProtector *)&activation_local,(Sexp **)&__contract_frame,"alloced_func");
  stdfnc.super__Function_base._M_functor._8_8_ = 0;
  stdfnc.super__Function_base._M_manager = (_Manager_type)0x0;
  auStack_68 = (undefined1  [8])0x0;
  stdfnc.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  if (func != (_func_Sexp_ptr_Sexp_ptr *)0x0) {
    stdfnc.super__Function_base._M_manager =
         std::_Function_handler<Sexp_*(Sexp_*),_Sexp_*(*)(Sexp_*)>::_M_invoke;
    stdfnc.super__Function_base._M_functor._8_8_ =
         std::_Function_handler<Sexp_*(Sexp_*),_Sexp_*(*)(Sexp_*)>::_M_manager;
    auStack_68 = (undefined1  [8])func;
  }
  std::function<Sexp_*(Sexp_*)>::function
            ((function<Sexp_*(Sexp_*)> *)&local_b8,(function<Sexp_*(Sexp_*)> *)auStack_68);
  NativeFunction::NativeFunction<Sexp*,Sexp*>(&local_c8,(function<Sexp_*(Sexp_*)> *)&local_b8);
  func_00.arity = extraout_RDX;
  func_00.func = (function<Sexp_*(Sexp_**)> *)local_c8.arity;
  __contract_frame.protected_frame =
       (ContractFrame *)GcHeap::AllocateNativeFunction((GcHeap *)local_c8.func,func_00);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  symbol = g_the_environment;
  std::__cxx11::string::string
            ((string *)(local_98 + 0x10),name,(allocator *)((long)&__frame_prot.protected_frame + 7)
            );
  SymbolInterner::InternSymbol((string *)(local_98 + 0x10));
  Environment::DefineGlobal((Environment *)local_98,(size_t)symbol);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  Activation::Set((alloced_func->field_1).activation,local_98._8_8_,local_98._0_8_,
                  (Sexp *)__contract_frame.protected_frame);
  if (stdfnc.super__Function_base._M_functor._8_8_ != 0) {
    (*(code *)stdfnc.super__Function_base._M_functor._8_8_)(auStack_68,auStack_68,3);
  }
  FrameProtector::~FrameProtector((FrameProtector *)&activation_local);
  ContractFrameProtector::~ContractFrameProtector((ContractFrameProtector *)&stdfnc._M_invoker);
  return;
}

Assistant:

void LoadSingleBuiltin(Sexp *activation, const char *name, F func) {
  CONTRACT { PRECONDITION(activation->IsActivation()); }